

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

void __thiscall
OpenMD::DataStorage::internalResize<OpenMD::Vector3<double>>
          (DataStorage *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *v,
          size_t newSize)

{
  size_type sVar1;
  iterator this_00;
  ulong in_RDX;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_RSI;
  iterator i;
  size_t oldSize;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  *in_stack_ffffffffffffff70;
  unsigned_long in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  
  sVar1 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                    (in_RSI);
  if (sVar1 != in_RDX) {
    if (sVar1 < in_RDX) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::end
                (in_stack_ffffffffffffff68);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>const*,std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>>
      ::__normal_iterator<OpenMD::Vector3<double>*>
                ((__normal_iterator<const_OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                  *)in_RSI,
                 (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                  *)in_stack_ffffffffffffff68);
      Vector3<double>::Vector3((Vector3<double> *)0x22dcee);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::insert
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                 (size_type)in_stack_ffffffffffffff98._M_current,
                 in_stack_ffffffffffffff90._M_current);
    }
    else {
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::__normal_iterator((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                           *)&stack0xffffffffffffffa8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::begin
                (in_stack_ffffffffffffff68);
      std::
      advance<__gnu_cxx::__normal_iterator<OpenMD::Vector3<double>*,std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>>,unsigned_long>
                ((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                  *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff88);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>const*,std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>>
      ::__normal_iterator<OpenMD::Vector3<double>*>
                (in_stack_ffffffffffffff70,
                 (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                  *)in_RSI);
      this_00 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::end
                          (in_RSI);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>const*,std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>>
      ::__normal_iterator<OpenMD::Vector3<double>*>
                (in_stack_ffffffffffffff70,
                 (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                  *)in_RSI);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::erase
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 this_00._M_current,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }